

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O1

int Abc_NodeBalanceConeExor_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vSuper,int fFirst)

{
  uint uVar1;
  uint uVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  void **ppvVar6;
  long lVar7;
  
  uVar1 = vSuper->nSize;
  if (0 < (long)(int)uVar1) {
    lVar7 = 0;
    do {
      if ((Abc_Obj_t *)vSuper->pArray[lVar7] == pNode) {
        return 1;
      }
      lVar7 = lVar7 + 1;
    } while ((int)uVar1 != lVar7);
  }
  if ((fFirst != 0) || ((*(uint *)&pNode->field_0x14 & 0x10f) == 0x107)) {
    if (((ulong)pNode & 1) != 0) {
      __assert_fail("!Abc_ObjIsComplement(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                    ,0x195,"int Abc_NodeBalanceConeExor_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
    }
    if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
      if ((*(uint *)&pNode->field_0x14 >> 8 & 1) != 0) {
        plVar3 = (long *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
        iVar4 = Abc_NodeBalanceConeExor_rec
                          (*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8)
                           ,vSuper,0);
        plVar3 = (long *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
        iVar5 = Abc_NodeBalanceConeExor_rec
                          (*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                            (long)*(int *)(plVar3[4] + 4) * 8),vSuper,0);
        return (uint)(iVar5 != 0 || iVar4 != 0);
      }
      __assert_fail("pNode->fExor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                    ,0x197,"int Abc_NodeBalanceConeExor_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
    }
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                  ,0x196,"int Abc_NodeBalanceConeExor_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
  }
  uVar2 = vSuper->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar6;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar2 * 2;
      if (iVar4 <= (int)uVar2) goto LAB_00297313;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vSuper->pArray,(ulong)uVar2 << 4);
      }
      vSuper->pArray = ppvVar6;
    }
    vSuper->nCap = iVar4;
  }
LAB_00297313:
  iVar4 = vSuper->nSize;
  vSuper->nSize = iVar4 + 1;
  vSuper->pArray[iVar4] = pNode;
  return 0;
}

Assistant:

int Abc_NodeBalanceConeExor_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vSuper, int fFirst )
{
    int RetValue1, RetValue2, i;
    // check if the node occurs in the same polarity
    for ( i = 0; i < vSuper->nSize; i++ )
        if ( vSuper->pArray[i] == pNode )
            return 1;
    // if the new node is complemented or a PI, another gate begins
    if ( !fFirst && (!pNode->fExor || !Abc_ObjIsNode(pNode)) )
    {
        Vec_PtrPush( vSuper, pNode );
        return 0;
    }
    assert( !Abc_ObjIsComplement(pNode) );
    assert( Abc_ObjIsNode(pNode) );
    assert( pNode->fExor );
    // go through the branches
    RetValue1 = Abc_NodeBalanceConeExor_rec( Abc_ObjFanin0(Abc_ObjFanin0(pNode)), vSuper, 0 );
    RetValue2 = Abc_NodeBalanceConeExor_rec( Abc_ObjFanin1(Abc_ObjFanin0(pNode)), vSuper, 0 );
    if ( RetValue1 == -1 || RetValue2 == -1 )
        return -1;
    // return 1 if at least one branch has a duplicate
    return RetValue1 || RetValue2;
}